

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_tibor_maps.hpp
# Opt level: O3

void __thiscall PatchOptimizeTiborMaps::alter_world(PatchOptimizeTiborMaps *this,World *world)

{
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *this_00;
  mapped_type *ppMVar1;
  key_type local_10 [4];
  
  local_10[0] = 0x328;
  this_00 = &world->_maps;
  ppMVar1 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this_00,local_10);
  Map::remove_entity(*ppMVar1,'\x05',true);
  local_10[1] = 0x32b;
  ppMVar1 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this_00,local_10 + 1);
  Map::remove_entity(*ppMVar1,'\x04',true);
  local_10[2] = 0x32c;
  ppMVar1 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this_00,local_10 + 2);
  Map::remove_entity(*ppMVar1,'\x02',true);
  local_10[3] = 0x32f;
  ppMVar1 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this_00,local_10 + 3);
  Map::remove_entity(*ppMVar1,'\x03',true);
  return;
}

Assistant:

void alter_world(World& world) override
    {
        // Remove a few ghosts from laggy Tibor maps
        world.map(MAP_TIBOR_808)->remove_entity(5);

        world.map(MAP_TIBOR_811)->remove_entity(4);

        world.map(MAP_TIBOR_812)->remove_entity(2);

        world.map(MAP_TIBOR_815)->remove_entity(3);
    }